

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall
Analyser_removeExternalVariableByName_Test::TestBody
          (Analyser_removeExternalVariableByName_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AnalyserPtr analyser;
  ModelPtr model;
  ParserPtr parser;
  long *local_c8 [2];
  long local_b8 [2];
  AssertionResult local_a8;
  long local_98 [2];
  shared_ptr local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  shared_ptr *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Parser::create(SUB81(local_30,0));
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_a8);
  libcellml::Parser::parseModel(local_50);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  local_c8[0] = (long *)0x0;
  local_60 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,"size_t(0)","parser->issueCount()",(unsigned_long *)local_c8,
             (unsigned_long *)&local_60);
  if ((string)local_a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1dd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_c8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8[0] != (long *)0x0)) {
        (**(code **)(*local_c8[0] + 8))();
      }
      local_c8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Analyser::create();
  psVar1 = local_60;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"membrane","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"V","");
  bVar3 = libcellml::Analyser::removeExternalVariable(psVar1,local_50,(string *)&local_a8);
  local_88[0] = (shared_ptr)(bVar3 ^ 1);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_88[0] == (shared_ptr)0x0) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)local_88,
               "analyser->removeExternalVariable(model, \"membrane\", \"V\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e1,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_c8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8[0] != (long *)0x0)) {
        (**(code **)(*local_c8[0] + 8))();
      }
      local_c8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_60;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"membrane","");
  libcellml::ComponentEntity::component(local_40,(bool)local_50[0]);
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"V","");
  libcellml::Component::variable((string *)&local_78);
  libcellml::AnalyserExternalVariable::create(local_88);
  libcellml::Analyser::addExternalVariable(psVar1);
  if (local_80.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.ptr_);
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_60;
  local_78 = 0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"membrane","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"V","");
  bVar3 = libcellml::Analyser::removeExternalVariable
                    (psVar1,(string *)&local_78,(string *)&local_a8);
  local_88[0] = (shared_ptr)(bVar3 ^ 1);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  if (local_88[0] == (shared_ptr)0x0) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)local_88,
               "analyser->removeExternalVariable(nullptr, \"membrane\", \"V\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e5,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_c8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8[0] != (long *)0x0)) {
        (**(code **)(*local_c8[0] + 8))();
      }
      local_c8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_60;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"X","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"V","");
  bVar3 = libcellml::Analyser::removeExternalVariable(psVar1,local_50,(string *)&local_a8);
  local_88[0] = (shared_ptr)(bVar3 ^ 1);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_88[0] == (shared_ptr)0x0) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)local_88,"analyser->removeExternalVariable(model, \"X\", \"V\")",
               "true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e6,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_c8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8[0] != (long *)0x0)) {
        (**(code **)(*local_c8[0] + 8))();
      }
      local_c8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_60;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"membrane","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"X","");
  bVar3 = libcellml::Analyser::removeExternalVariable(psVar1,local_50,(string *)&local_a8);
  local_88[0] = (shared_ptr)(bVar3 ^ 1);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_88[0] == (shared_ptr)0x0) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)local_88,
               "analyser->removeExternalVariable(model, \"membrane\", \"X\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e7,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_c8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8[0] != (long *)0x0)) {
        (**(code **)(*local_c8[0] + 8))();
      }
      local_c8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_60;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"membrane","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"V","");
  local_88[0] = (shared_ptr)
                libcellml::Analyser::removeExternalVariable(psVar1,local_50,(string *)&local_a8);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_88[0] == (shared_ptr)0x0) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)local_88,
               "analyser->removeExternalVariable(model, \"membrane\", \"V\")","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e8,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_c8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8[0] != (long *)0x0)) {
        (**(code **)(*local_c8[0] + 8))();
      }
      local_c8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_60;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"membrane","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"V","");
  bVar3 = libcellml::Analyser::removeExternalVariable(psVar1,local_50,(string *)&local_a8);
  local_88[0] = (shared_ptr)(bVar3 ^ 1);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_88[0] == (shared_ptr)0x0) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)local_88,
               "analyser->removeExternalVariable(model, \"membrane\", \"V\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e9,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_c8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8[0] != (long *)0x0)) {
        (**(code **)(*local_c8[0] + 8))();
      }
      local_c8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Analyser, removeExternalVariableByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    EXPECT_FALSE(analyser->removeExternalVariable(model, "membrane", "V"));

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V")));

    EXPECT_FALSE(analyser->removeExternalVariable(nullptr, "membrane", "V"));
    EXPECT_FALSE(analyser->removeExternalVariable(model, "X", "V"));
    EXPECT_FALSE(analyser->removeExternalVariable(model, "membrane", "X"));
    EXPECT_TRUE(analyser->removeExternalVariable(model, "membrane", "V"));
    EXPECT_FALSE(analyser->removeExternalVariable(model, "membrane", "V"));
}